

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

bool __thiscall HighsLp::hasInfiniteCost(HighsLp *this,double infinite_cost)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = this->num_col_;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    uVar5 = uVar3;
    if ((uVar4 == uVar5) ||
       (dVar1 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5], infinite_cost <= dVar1)) break;
    uVar3 = uVar5 + 1;
  } while (-infinite_cost < dVar1);
  return (long)uVar5 < (long)(int)uVar2;
}

Assistant:

bool HighsLp::hasInfiniteCost(const double infinite_cost) const {
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    if (this->col_cost_[iCol] >= infinite_cost) return true;
    if (this->col_cost_[iCol] <= -infinite_cost) return true;
  }
  return false;
}